

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void boundaryPM(BPMLists *lists,BPMNode *leaves,size_t numpresent,int c,int num)

{
  int weight;
  BPMNode *pBVar1;
  int in_ECX;
  BPMNode *in_RDX;
  BPMLists *in_RSI;
  BPMLists *in_RDI;
  int in_R8D;
  int sum;
  uint lastindex;
  uint index;
  
  index = in_RDI->chains1[in_ECX]->index;
  if (in_ECX == 0) {
    if ((BPMNode *)(ulong)index < in_RDX) {
      *in_RDI->chains0 = *in_RDI->chains1;
      pBVar1 = bpmnode_create(in_RDI,(&in_RSI->memsize)[(ulong)index * 6],index + 1,(BPMNode *)0x0);
      in_RDI->chains1[in_ECX] = pBVar1;
    }
  }
  else {
    weight = in_RDI->chains0[in_ECX + -1]->weight + in_RDI->chains1[in_ECX + -1]->weight;
    in_RDI->chains0[in_ECX] = in_RDI->chains1[in_ECX];
    if (((BPMNode *)(ulong)index < in_RDX) && ((int)(&in_RSI->memsize)[(ulong)index * 6] < weight))
    {
      pBVar1 = bpmnode_create(in_RDI,(&in_RSI->memsize)[(ulong)index * 6],index + 1,
                              in_RDI->chains1[in_ECX]->tail);
      in_RDI->chains1[in_ECX] = pBVar1;
    }
    else {
      pBVar1 = bpmnode_create(in_RDI,weight,index,in_RDI->chains1[in_ECX + -1]);
      in_RDI->chains1[in_ECX] = pBVar1;
      if (in_R8D + 1 < (int)in_RDX * 2 + -2) {
        boundaryPM(in_RSI,in_RDX,CONCAT44(in_ECX,in_R8D),index,weight);
        boundaryPM(in_RSI,in_RDX,CONCAT44(in_ECX,in_R8D),index,weight);
      }
    }
  }
  return;
}

Assistant:

static void boundaryPM(BPMLists* lists, BPMNode* leaves, size_t numpresent, int c, int num)
{
	unsigned lastindex = lists->chains1[c]->index;

	if (c == 0)
	{
		if (lastindex >= numpresent) return;
		lists->chains0[c] = lists->chains1[c];
		lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, 0);
	}
	else
	{
		/*sum of the weights of the head nodes of the previous lookahead chains.*/
		int sum = lists->chains0[c - 1]->weight + lists->chains1[c - 1]->weight;
		lists->chains0[c] = lists->chains1[c];
		if (lastindex < numpresent && sum > leaves[lastindex].weight)
		{
			lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, lists->chains1[c]->tail);
			return;
		}
		lists->chains1[c] = bpmnode_create(lists, sum, lastindex, lists->chains1[c - 1]);
		/*in the end we are only interested in the chain of the last list, so no
		need to recurse if we're at the last one (this gives measurable speedup)*/
		if (num + 1 < (int)(2 * numpresent - 2))
		{
			boundaryPM(lists, leaves, numpresent, c - 1, num);
			boundaryPM(lists, leaves, numpresent, c - 1, num);
		}
	}
}